

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

TPM_RC TPMI_ALG_ECC_SCHEME_Unmarshal
                 (TPMI_ALG_ECC_SCHEME *target,BYTE **buffer,INT32 *size,BOOL flag)

{
  ushort uVar1;
  int iVar2;
  UINT16 UVar3;
  TPM_RC TVar4;
  
  iVar2 = *size;
  *size = iVar2 + -2;
  TVar4 = 0x9a;
  if (1 < iVar2) {
    UVar3 = ByteArrayToUint16(*buffer);
    *target = UVar3;
    *buffer = *buffer + 2;
    uVar1 = *target;
    if (((uVar1 - 0x18 < 3) || (uVar1 == 0x1c)) || ((TVar4 = 0x92, uVar1 == 0x10 && (flag != 0)))) {
      TVar4 = 0;
    }
  }
  return TVar4;
}

Assistant:

TPM_RC
TPMI_ALG_ECC_SCHEME_Unmarshal(TPMI_ALG_ECC_SCHEME *target, BYTE **buffer, INT32 *size, BOOL flag)
{
    TPM_RC    result;
    result = TPM_ALG_ID_Unmarshal((TPM_ALG_ID *)target, buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    switch (*target) {
#if         ALG_ECDAA
        case TPM_ALG_ECDAA:
#endif // ALG_ECDAA
#if         ALG_ECDSA
        case TPM_ALG_ECDSA:
#endif // ALG_ECDSA
#if         ALG_SM2
        case TPM_ALG_SM2:
#endif // ALG_SM2
#if         ALG_ECSCHNORR
        case TPM_ALG_ECSCHNORR:
#endif // ALG_ECSCHNORR
#if         ALG_ECDH
        case TPM_ALG_ECDH:
#endif // ALG_ECDH
#if         ALG_ECMQV
        case TPM_ALG_ECMQV:
#endif // ALG_ECMQV
            break;
        case TPM_ALG_NULL:
        if (flag)
            break;
        return TPM_RC_SCHEME;
        default:
            return TPM_RC_SCHEME;
    }
    return TPM_RC_SUCCESS;
}